

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

ArgumentMismatch *
CLI::ArgumentMismatch::PartialType
          (ArgumentMismatch *__return_storage_ptr__,string *name,int num,string *type)

{
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ::std::operator+(&local_40,name,": ");
  ::std::operator+(&local_c0,&local_40,type);
  ::std::operator+(&local_a0,&local_c0," only partially specified: ");
  std::__cxx11::to_string(&local_e0,num);
  ::std::operator+(&local_80,&local_a0,&local_e0);
  ::std::operator+(&local_60,&local_80," required for each element");
  ArgumentMismatch(__return_storage_ptr__,&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static ArgumentMismatch PartialType(std::string name, int num, std::string type) {
        return ArgumentMismatch(name + ": " + type + " only partially specified: " + std::to_string(num) +
                                " required for each element");
    }